

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O0

void dbgaddhist(dbgcxdef *ctx,char *buf,int l)

{
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  int dell;
  char *p;
  int local_24;
  char *local_20;
  
  if (*(uint *)(in_RDI + 0x1300) <= *(int *)(in_RDI + 0x1304) + in_EDX + 1U) {
    local_24 = 0;
    for (local_20 = *(char **)(in_RDI + 0x12f8); *local_20 != '\0' || local_24 < in_EDX;
        local_20 = local_20 + 1) {
      local_24 = local_24 + 1;
    }
    memmove(*(void **)(in_RDI + 0x12f8),(void *)(*(long *)(in_RDI + 0x12f8) + (long)local_24),
            (ulong)(uint)(*(int *)(in_RDI + 0x1304) - local_24));
    *(int *)(in_RDI + 0x1304) = *(int *)(in_RDI + 0x1304) - local_24;
  }
  memcpy((void *)(*(long *)(in_RDI + 0x12f8) + (ulong)*(uint *)(in_RDI + 0x1304)),in_RSI,
         (long)in_EDX);
  *(int *)(in_RDI + 0x1304) = in_EDX + *(int *)(in_RDI + 0x1304);
  return;
}

Assistant:

void dbgaddhist(dbgcxdef *ctx, char *buf, int l)
{
    char *p;
    int   dell;

    if (ctx->dbgcxhstf + l + 1 >= ctx->dbgcxhstl)
    {
        /* delete first lines until we have enough space */
        for (dell = 0, p = ctx->dbgcxhstp ; *p || dell < l ; ++p, ++dell) ;
        if (*p) ++p;
        memmove(ctx->dbgcxhstp, ctx->dbgcxhstp + dell,
                (size_t)(ctx->dbgcxhstf - dell));
        ctx->dbgcxhstf -= dell;
    }
    memcpy(ctx->dbgcxhstp + ctx->dbgcxhstf, buf, (size_t)l);
    ctx->dbgcxhstf += l;
}